

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
::write_decimal<int>
          (arg_formatter_base<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_fmt::v6::detail::error_handler>
           *this,int value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  buffer<char> *c;
  
  uVar4 = (ulong)(uint)-value;
  if (0 < value) {
    uVar4 = (ulong)(uint)value;
  }
  uVar3 = (uint)uVar4;
  uVar5 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar6 = (ulong)((uVar5 - (uVar3 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                             (ulong)uVar5 * 4))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar8 = ((uint)value >> 0x1f) + sVar2 + uVar6;
  if (pbVar1->capacity_ < uVar8) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar8);
  }
  pcVar7 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar8;
  if (value < 0) {
    *pcVar7 = '-';
    pcVar7 = pcVar7 + 1;
  }
  pcVar7 = pcVar7 + uVar6;
  if (99 < uVar3) {
    do {
      uVar5 = (uint)uVar4;
      uVar3 = (uint)(uVar4 / 100);
      uVar4 = uVar4 / 100;
      *(undefined2 *)(pcVar7 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar5 + (int)uVar4 * -100) * 2);
      pcVar7 = pcVar7 + -2;
    } while (9999 < uVar5);
  }
  if (uVar3 < 10) {
    pcVar7[-1] = (byte)uVar3 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar7 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar3 * 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }